

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::_::ChainPromiseNode::fire()::__1>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_ed4e1ef7 *func)

{
  anon_class_8_1_ed4e1ef7 *func_local;
  
  _::ChainPromiseNode::fire::anon_class_8_1_ed4e1ef7::operator()((anon_class_8_1_ed4e1ef7 *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}